

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O1

void AddCubesToStartingCover(Vec_Wec_t *vEsop)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  drow *pdVar5;
  byte bVar6;
  int *pVars;
  int *pVarValues;
  long lVar7;
  Cube *pC;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  lVar10 = (long)g_CoverInfo.nVarsIn;
  pVars = (int *)malloc(lVar10 * 4);
  pVarValues = (int *)malloc(lVar10 * 4);
  if (0 < lVar10) {
    lVar7 = 0;
    do {
      pVars[lVar7] = (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (lVar10 != lVar7);
  }
  g_CoverInfo.nLiteralsBefore = 0;
  if (0 < vEsop->nSize) {
    lVar10 = 0;
    do {
      pVVar3 = vEsop->pArray;
      if (pVVar3[lVar10].nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
      }
      piVar4 = pVVar3[lVar10].pArray;
      uVar8 = pVVar3[lVar10].nSize - 1;
      pVVar3[lVar10].nSize = uVar8;
      uVar8 = piVar4[uVar8];
      lVar7 = (long)g_CoverInfo.nVarsIn;
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          pVarValues[lVar9] = 3;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      if (0 < pVVar3[lVar10].nSize) {
        lVar7 = 0;
        do {
          uVar2 = piVar4[lVar7];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf3,"int Abc_LitIsCompl(int)");
          }
          pVarValues[uVar2 >> 1] = 2 - (uVar2 & 1);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar3[lVar10].nSize);
      }
      pC = GetFreeCube();
      pdVar5 = pC->pCubeDataIn;
      if (*pdVar5 != 0) {
        if (0 < g_CoverInfo.nWordsIn) {
          lVar7 = 0;
          do {
            pdVar5[lVar7] = 0;
            lVar7 = lVar7 + 1;
          } while (lVar7 < g_CoverInfo.nWordsIn);
        }
        if (0 < g_CoverInfo.nWordsOut) {
          pdVar5 = pC->pCubeDataOut;
          lVar7 = 0;
          do {
            pdVar5[lVar7] = 0;
            lVar7 = lVar7 + 1;
          } while (lVar7 < g_CoverInfo.nWordsOut);
        }
      }
      InsertVarsWithoutClearing(pC,pVars,g_CoverInfo.nVarsIn,pVarValues,~uVar8);
      pC->a = (short)pVVar3[lVar10].nSize;
      pC->z = 1;
      iVar1 = g_CoverInfo.cIDs + 1;
      bVar6 = (byte)g_CoverInfo.cIDs;
      g_CoverInfo.cIDs = iVar1;
      pC->ID = bVar6;
      if (iVar1 == 0x100) {
        g_CoverInfo.cIDs = 1;
      }
      CheckForCloseCubes(pC,1);
      g_CoverInfo.nLiteralsBefore = g_CoverInfo.nLiteralsBefore + pVVar3[lVar10].nSize;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vEsop->nSize);
  }
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  if (pVarValues != (int *)0x0) {
    free(pVarValues);
  }
  if (g_CoverInfo.nCubesFree + g_CoverInfo.nCubesInUse == g_CoverInfo.nCubesAlloc) {
    return;
  }
  __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exor.c"
                ,0x27f,"void AddCubesToStartingCover(Vec_Wec_t *)");
}

Assistant:

void AddCubesToStartingCover( Vec_Wec_t * vEsop )
{
    Vec_Int_t * vCube;
    Cube * pNew;
    int * s_Level2Var;
    int * s_LevelValues;
    int c, i, k, Lit, Out;

    s_Level2Var = ABC_ALLOC( int, g_CoverInfo.nVarsIn );
    s_LevelValues = ABC_ALLOC( int, g_CoverInfo.nVarsIn );

    for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
        s_Level2Var[i] = i;

    g_CoverInfo.nLiteralsBefore = 0;
    Vec_WecForEachLevel( vEsop, vCube, c )
    {
        // get the output of this cube
        Out = -Vec_IntPop(vCube) - 1;

        // fill in the cube with blanks
        for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
            s_LevelValues[i] = VAR_ABS;
        Vec_IntForEachEntry( vCube, Lit, k )
        {
            if ( Abc_LitIsCompl(Lit) )
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_NEG;
            else
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_POS;
        }

        // get the new cube
        pNew = GetFreeCube();
        // consider the need to clear the cube
        if ( pNew->pCubeDataIn[0] ) // this is a recycled cube
        {
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                pNew->pCubeDataIn[i] = 0;
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                pNew->pCubeDataOut[i] = 0;
        }

        InsertVarsWithoutClearing( pNew, s_Level2Var, g_CoverInfo.nVarsIn, s_LevelValues, Out );
        // set literal counts
        pNew->a = Vec_IntSize(vCube);
        pNew->z = 1;
        // set the ID
        pNew->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // add this cube to storage
        CheckForCloseCubes( pNew, 1 );

        g_CoverInfo.nLiteralsBefore += Vec_IntSize(vCube);
    }
    ABC_FREE( s_Level2Var );
    ABC_FREE( s_LevelValues );

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );
}